

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
::prepare_insert(raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                 *this,size_t hashval)

{
  bool bVar1;
  size_t *psVar2;
  byte local_41;
  undefined1 local_28 [8];
  FindInfo target;
  size_t hashval_local;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  *this_local;
  
  if (this->ctrl_ == (ctrl_t *)0x0) {
    rehash_and_grow_if_necessary(this);
  }
  _local_28 = find_first_non_full(this,hashval);
  psVar2 = growth_left(this);
  local_41 = 0;
  if (*psVar2 == 0) {
    bVar1 = IsDeleted(this->ctrl_[(long)local_28]);
    local_41 = bVar1 ^ 0xff;
  }
  if ((local_41 & 1) != 0) {
    rehash_and_grow_if_necessary(this);
    _local_28 = find_first_non_full(this,hashval);
  }
  this->size_ = this->size_ + 1;
  bVar1 = IsEmpty(this->ctrl_[(long)local_28]);
  psVar2 = growth_left(this);
  *psVar2 = *psVar2 - (ulong)bVar1;
  HashtablezInfoHandle::RecordInsert
            ((HashtablezInfoHandle *)&this->field_0x20,hashval,target.offset);
  return (size_t)local_28;
}

Assistant:

size_t prepare_insert(size_t hashval) PHMAP_ATTRIBUTE_NOINLINE {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                rehash_and_grow_if_necessary();
        }
        FindInfo target = find_first_non_full(hashval);
        if (PHMAP_PREDICT_FALSE(growth_left() == 0 &&
                               !IsDeleted(ctrl_[target.offset]))) {
            rehash_and_grow_if_necessary();
            target = find_first_non_full(hashval);
        }
        ++size_;
        growth_left() -= IsEmpty(ctrl_[target.offset]);
        // set_ctrl(target.offset, H2(hashval));
        infoz_.RecordInsert(hashval, target.probe_length);
        return target.offset;
    }